

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

WriteThirdPartyDescriptorResult * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::writeThirdPartyDescriptor
          (WriteThirdPartyDescriptorResult *__return_storage_ptr__,RpcClient *this,
          Connection *provider,Connection *recipient,Builder contact)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Question *pQVar3;
  undefined8 *local_148;
  long lStack_140;
  QuestionId questionId;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> questionRef;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> otherMsg;
  undefined1 local_100 [24];
  OwnOwn<capnp::ClientHook,_std::nullptr_t> _redirect1029;
  Builder local_98;
  Builder local_80;
  Builder provide;
  
  pQVar3 = anon_unknown_18::
           ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::
           nextHigh(&((this->connectionState).ptr)->questions,(uint *)&questionId);
  pQVar3->isAwaitingReturn = false;
  kj::
  refcounted<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,capnp::_::RpcSystemBase::RpcConnectionState&,unsigned_int&,kj::None_const&>
            ((RpcConnectionState *)&questionRef,(uint *)(this->connectionState).ptr,
             (None *)&questionId);
  (pQVar3->selfRef).ptr = questionRef.ptr;
  (**provider->_vptr_Connection)(&otherMsg,provider,0x26);
  (**(otherMsg.ptr)->_vptr_OutgoingRpcMessage)(local_100);
  AnyPointer::Builder::initAs<capnp::rpc::Message>
            ((BuilderFor<capnp::rpc::Message> *)&_redirect1029,(Builder *)local_100);
  rpc::Message::Builder::initProvide(&provide,(Builder *)&_redirect1029);
  *(QuestionId *)provide._builder.data = questionId;
  rpc::Provide::Builder::initTarget(&local_80,&provide);
  (*(this->super_ClientHook)._vptr_ClientHook[10])(local_100,this);
  uVar2 = local_100._8_8_;
  uVar1 = CONCAT44(local_100._4_4_,local_100._0_4_);
  _redirect1029.value.ptr = (ClientHook *)local_100._8_8_;
  local_100._8_8_ = (Disposer *)0x0;
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)local_100);
  if ((ClientHook *)uVar2 != (ClientHook *)0x0) {
    __return_storage_ptr__->tag = 2;
    *(undefined8 *)&__return_storage_ptr__->field_1 = uVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = uVar2;
    _redirect1029.value.ptr = (ClientHook *)0x0;
  }
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&_redirect1029.value);
  if ((ClientHook *)uVar2 == (ClientHook *)0x0) {
    rpc::Provide::Builder::initRecipient(&local_98,&provide);
    (*recipient->_vptr_Connection[7])(recipient,provider);
    (*(otherMsg.ptr)->_vptr_OutgoingRpcMessage[2])();
    (*(this->super_ClientHook)._vptr_ClientHook[4])(&_redirect1029,this);
    local_100._0_4_ = 1;
    local_100._8_8_ = questionRef.disposer;
    local_100._16_8_ = questionRef.ptr;
    questionRef.ptr = (QuestionRef *)0x0;
    kj::heap<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo>
              ((kj *)&local_148,(VineInfo *)local_100);
    lStack_140 = 0;
    kj::
    OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,kj::Own<capnp::ClientHook,decltype(nullptr)>>
    ::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,int>
              ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                *)__return_storage_ptr__,(VineToExport *)&_redirect1029);
    VineToExport::~VineToExport((VineToExport *)&_redirect1029);
    if (lStack_140 != 0) {
      lStack_140 = 0;
      (**(code **)*local_148)();
    }
    kj::
    OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_>
    ::~OneOf((OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_>
              *)local_100);
  }
  kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::dispose(&otherMsg);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::dispose
            (&questionRef);
  return __return_storage_ptr__;
}

Assistant:

virtual WriteThirdPartyDescriptorResult writeThirdPartyDescriptor(
          VatNetworkBase::Connection& provider,
          VatNetworkBase::Connection& recipient,
          AnyPointer::Builder contact) {
      // Called to fill in a ThirdPartyCapDescriptor when sending this capability to a different
      // connection.
      //
      // `provider` is this object's backing connection; the caller has already verified it is
      // currently connected. (Calling connectionState->tryGetConnection() would return the same
      // object.)
      //
      // `recipient` is the connection receiving the ThirdPartyCapDescriptor.
      //
      // `contact` is the ThirdPartyToContact which goes in the descriptor.
      //
      // Returns the ClientHook which should be used as the "vine". This needs to be callable as
      // a stand-in for the object. It also needs to hold open the `Provide` operation until the
      // returned reference is dropped. Note that `addRef()`s on the returned reference do NOT have
      // to hold open the Provide; the Provide can be held open by an attachment on the ref itself.
      //
      // The default implementation of this method is appropriate most of the time. It is
      // overridded for the specific case of `DeferredThirdPartyClient`.

      // Send `Provide` message to our connection.
      QuestionId questionId;
      auto& question = connectionState->questions.nextHigh(questionId);
      question.isAwaitingReturn = false;  // No Return needed
      auto questionRef = kj::refcounted<QuestionRef>(*connectionState, questionId, kj::none);
      question.selfRef = *questionRef;

      auto otherMsg = provider.newOutgoingMessage(messageSizeHint<rpc::Provide>() + 32);
      auto provide = otherMsg->getBody().initAs<rpc::Message>().initProvide();
      provide.setQuestionId(questionId);
      KJ_IF_SOME(redirect, writeTarget(provide.initTarget())) {
        // Oops, this capability was redirected. This *shouldn't* happen since the immediate
        // caller of writeThirdPartyDescriptor() would have already followed redirects, but as it
        // happens, if we simply return the redirect here (without filling in `contact`), we are
        // honoring our contract.
        return kj::mv(redirect);
      }
      recipient.introduceTo(provider, contact, provide.initRecipient());
      otherMsg->send();

      return VineToExport {
        .vine = addRef(),
        .vineInfo = kj::heap(VineInfo { .info = kj::mv(questionRef) })
      };
    }